

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<signed_char,signed_char>::
Flush<duckdb::BitpackingCompressionState<signed_char,true,signed_char>::BitpackingWriter>
          (BitpackingState<signed_char,signed_char> *this)

{
  BitpackingState<signed_char,signed_char> *result;
  long lVar1;
  bool bVar2;
  BitpackingState<signed_char,signed_char> BVar3;
  unsigned_long uVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  BitpackingState<signed_char,signed_char> BVar9;
  byte bVar10;
  
  bVar8 = true;
  if (*(idx_t *)(this + 0x1810) != 0) {
    if (((this[0x1830] == (BitpackingState<signed_char,signed_char>)0x0) &&
        (this[0x1829] != this[0x1828])) || (1 < (byte)((char)this[0x1833] - 1U))) {
      result = this + 0x182a;
      BVar3 = (BitpackingState<signed_char,signed_char>)
              TrySubtractOperator::Operation<signed_char,signed_char,signed_char>
                        ((int8_t)this[0x1829],(int8_t)this[0x1828],(int8_t *)result);
      this[0x1832] = BVar3;
      BitpackingState<signed_char,_signed_char>::CalculateDeltaStats
                ((BitpackingState<signed_char,_signed_char> *)this);
      if (this[0x1831] == (BitpackingState<signed_char,signed_char>)0x1) {
        BVar3 = this[0x182b];
        if ((this[0x182c] == BVar3) && (((byte)this[0x1833] & 0xfe) != 4)) {
          BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::
          WriteConstantDelta((char)this[0x182c],**(char **)(this + 0x808),*(idx_t *)(this + 0x1810),
                             *(char **)(this + 0x808),(bool *)(this + 0x1010),
                             *(void **)(this + 0x1820));
          *(long *)(this + 0x1818) = *(long *)(this + 0x1818) + 6;
          return true;
        }
        BVar9 = this[0x182d];
        bVar6 = 0;
        bVar7 = bVar6;
        if (BVar9 != (BitpackingState<signed_char,signed_char>)0x0) {
          do {
            bVar6 = bVar6 + 1;
            bVar2 = 1 < (byte)BVar9;
            BVar9 = (BitpackingState<signed_char,signed_char>)((char)BVar9 >> 1);
          } while (bVar2);
          bVar7 = 8;
          if (bVar6 < 8) {
            bVar7 = bVar6;
          }
        }
        BVar9 = *result;
        if (BVar9 == (BitpackingState<signed_char,signed_char>)0x0) {
          bVar6 = 0;
        }
        else {
          bVar6 = 8;
          if (BVar9 != (BitpackingState<signed_char,signed_char>)0x80) {
            bVar10 = 1;
            bVar6 = ((byte)BVar9 ^ (char)BVar9 >> 7) - ((char)BVar9 >> 7);
            do {
              bVar10 = bVar10 + 1;
              bVar2 = 1 < bVar6;
              bVar6 = (char)bVar6 >> 1;
            } while (bVar2);
            bVar6 = 8;
            if (bVar10 < 8) {
              bVar6 = bVar10;
            }
          }
        }
        BVar9 = this[0x1833];
        if (BVar9 != (BitpackingState<signed_char,signed_char>)0x5 && bVar7 < bVar6) {
          if (*(long *)(this + 0x1810) != 0) {
            uVar5 = 0;
            do {
              this[uVar5 + 0x810] =
                   (BitpackingState<signed_char,signed_char>)
                   ((char)this[uVar5 + 0x810] - (char)BVar3);
              uVar5 = uVar5 + 1;
            } while (uVar5 < *(ulong *)(this + 0x1810));
          }
          BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::
          WriteDeltaFor((char *)(this + 0x810),(bool *)(this + 0x1010),bVar7,(char)this[0x182b],
                        (char)this[0x182e],*(char **)(this + 0x808),*(idx_t *)(this + 0x1810),
                        *(void **)(this + 0x1820));
          *(long *)(this + 0x1818) = *(long *)(this + 0x1818) + 10;
          uVar5 = *(ulong *)(this + 0x1810);
          if ((uVar5 & 0x1f) != 0) {
            uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar5 & 0x1f);
            uVar5 = (uVar5 - uVar4) + 0x20;
          }
          *(ulong *)(this + 0x1818) = *(long *)(this + 0x1818) + (bVar7 * uVar5 >> 3);
          if (BVar9 != (BitpackingState<signed_char,signed_char>)0x5 && bVar7 < bVar6) {
            return true;
          }
        }
      }
      if (this[0x1832] == (BitpackingState<signed_char,signed_char>)0x1) {
        if (*result == (BitpackingState<signed_char,signed_char>)0x0) {
          bVar7 = 0;
        }
        else {
          bVar6 = 0;
          BVar3 = *result;
          do {
            bVar6 = bVar6 + 1;
            bVar2 = 1 < (byte)BVar3;
            BVar3 = (BitpackingState<signed_char,signed_char>)((char)BVar3 >> 1);
          } while (bVar2);
          bVar7 = 8;
          if (bVar6 < 8) {
            bVar7 = bVar6;
          }
        }
        if (*(long *)(this + 0x1810) != 0) {
          lVar1 = *(long *)(this + 0x808);
          BVar3 = this[0x1828];
          uVar5 = 0;
          do {
            *(char *)(lVar1 + uVar5) = *(char *)(lVar1 + uVar5) - (char)BVar3;
            uVar5 = uVar5 + 1;
          } while (uVar5 < *(ulong *)(this + 0x1810));
        }
        BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::WriteFor
                  (*(char **)(this + 0x808),(bool *)(this + 0x1010),bVar7,(char)this[0x1828],
                   *(idx_t *)(this + 0x1810),*(void **)(this + 0x1820));
        uVar5 = *(ulong *)(this + 0x1810);
        if ((uVar5 & 0x1f) != 0) {
          uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar5 & 0x1f);
          uVar5 = (uVar5 - uVar4) + 0x20;
        }
        *(ulong *)(this + 0x1818) = *(long *)(this + 0x1818) + (bVar7 * uVar5 >> 3) + 9;
      }
      else {
        bVar8 = false;
      }
    }
    else {
      BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::WriteConstant
                ((char)this[0x1829],*(idx_t *)(this + 0x1810),*(void **)(this + 0x1820),
                 (bool)this[0x1830]);
      *(long *)(this + 0x1818) = *(long *)(this + 0x1818) + 5;
    }
  }
  return bVar8;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}